

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O0

void __thiscall QPageSetupWidget::initPageSizes(QPageSetupWidget *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  QPlatformPrinterSupport *pQVar4;
  long in_RDI;
  long in_FS_OFFSET;
  int id;
  QPageSize *pageSize;
  QList<QPageSize> *__range3;
  QPlatformPrinterSupport *ps;
  QPageSize pageSize_1;
  const_iterator __end3;
  const_iterator __begin3;
  QList<QPageSize> pageSizes;
  QPageSize defaultSize;
  QPrintDevice printDevice;
  int in_stack_fffffffffffffe3c;
  QVariant *in_stack_fffffffffffffe40;
  QPageSize *in_stack_fffffffffffffe48;
  QComboBox *in_stack_fffffffffffffe50;
  PageSizeId local_184;
  undefined8 local_140 [10];
  QPageSize *local_f0;
  const_iterator local_e8;
  const_iterator local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)(in_RDI + 0x1f0) = 1;
  QComboBox::clear();
  *(undefined4 *)(in_RDI + 500) = 0xffffffff;
  if (((*(int *)(in_RDI + 0x1b0) == 0) && (bVar2 = QString::isEmpty((QString *)0x163d18), !bVar2))
     && (pQVar4 = QPlatformPrinterSupportPlugin::get(), pQVar4 != (QPlatformPrinterSupport *)0x0)) {
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    (*pQVar4->_vptr_QPlatformPrinterSupport[4])(&local_b8,pQVar4,in_RDI + 0x1b8);
    local_c0 = 0xaaaaaaaaaaaaaaaa;
    QPrintDevice::defaultPageSize((QPrintDevice *)in_stack_fffffffffffffe48);
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    local_d0 = 0xaaaaaaaaaaaaaaaa;
    local_c8 = 0xaaaaaaaaaaaaaaaa;
    QPrintDevice::supportedPageSizes((QPrintDevice *)in_stack_fffffffffffffe48);
    local_e0.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
    local_e0 = QList<QPageSize>::begin((QList<QPageSize> *)in_stack_fffffffffffffe40);
    local_e8.i = (QPageSize *)0xaaaaaaaaaaaaaaaa;
    local_e8 = QList<QPageSize>::end((QList<QPageSize> *)in_stack_fffffffffffffe40);
    while( true ) {
      local_f0 = local_e8.i;
      bVar2 = QList<QPageSize>::const_iterator::operator!=(&local_e0,local_e8);
      if (!bVar2) break;
      QList<QPageSize>::const_iterator::operator*(&local_e0);
      QPageSize::name();
      QVariant::fromValue<QPageSize>(in_stack_fffffffffffffe48);
      QComboBox::addItem(in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
      QVariant::~QVariant(&local_28);
      QString::~QString((QString *)0x163eef);
      QList<QPageSize>::const_iterator::operator++(&local_e0);
    }
    iVar3 = QComboBox::count();
    if (iVar3 < 1) {
      bVar2 = false;
    }
    else {
      bVar2 = QPrintDevice::supportsCustomPageSizes((QPrintDevice *)in_stack_fffffffffffffe40);
      if (bVar2) {
        tr((char *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
           in_stack_fffffffffffffe3c);
        QVariant::QVariant((QVariant *)0x163f66);
        QComboBox::addItem(in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40);
        QVariant::~QVariant(&local_48);
        QString::~QString((QString *)0x163f9a);
        iVar3 = QComboBox::count();
        *(int *)(in_RDI + 500) = iVar3 + -1;
      }
      *(undefined1 *)(in_RDI + 0x1f0) = 0;
      QComboBox::setCurrentIndex((int)*(undefined8 *)(in_RDI + 0x48));
      uVar1 = *(undefined8 *)(in_RDI + 0x48);
      in_stack_fffffffffffffe50 = *(QComboBox **)(in_RDI + 0x48);
      QVariant::fromValue<QPageSize>(in_stack_fffffffffffffe48);
      Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                    (enum_type)in_stack_fffffffffffffe40);
      QComboBox::findData((QVariant *)in_stack_fffffffffffffe50,(int)&local_68,
                          (QFlags_conflict *)0x100);
      QComboBox::setCurrentIndex((int)uVar1);
      QVariant::~QVariant(&local_68);
      bVar2 = true;
    }
    QList<QPageSize>::~QList((QList<QPageSize> *)0x164061);
    QPageSize::~QPageSize((QPageSize *)&local_c0);
    QPrintDevice::~QPrintDevice((QPrintDevice *)0x16407b);
    if (bVar2) goto LAB_001641e9;
  }
  for (local_184 = AnsiA; (int)local_184 < 0x76; local_184 = local_184 + Legal) {
    if (local_184 == Custom) {
      in_stack_fffffffffffffe48 = *(QPageSize **)(in_RDI + 0x48);
      tr((char *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
         in_stack_fffffffffffffe3c);
      QVariant::QVariant((QVariant *)0x1640e4);
      QComboBox::addItem(in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
      QVariant::~QVariant(&local_88);
      QString::~QString((QString *)0x164118);
      iVar3 = QComboBox::count();
      *(int *)(in_RDI + 500) = iVar3 + -1;
    }
    else {
      local_140[0] = 0xaaaaaaaaaaaaaaaa;
      QPageSize::QPageSize((QPageSize *)local_140,local_184);
      in_stack_fffffffffffffe40 = *(QVariant **)(in_RDI + 0x48);
      QPageSize::name();
      QVariant::fromValue<QPageSize>(in_stack_fffffffffffffe48);
      QComboBox::addItem(in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe40);
      QVariant::~QVariant(&local_a8);
      QString::~QString((QString *)0x1641be);
      QPageSize::~QPageSize((QPageSize *)local_140);
    }
  }
  *(undefined1 *)(in_RDI + 0x1f0) = 0;
LAB_001641e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPageSetupWidget::initPageSizes()
{
    m_blockSignals = true;

    m_ui.pageSizeCombo->clear();

    m_realCustomPageSizeIndex = -1;

    if (m_outputFormat == QPrinter::NativeFormat && !m_printerName.isEmpty()) {
        QPlatformPrinterSupport *ps = QPlatformPrinterSupportPlugin::get();
        if (ps) {
            QPrintDevice printDevice = ps->createPrintDevice(m_printerName);
            const QPageSize defaultSize = printDevice.defaultPageSize();
            const auto pageSizes = printDevice.supportedPageSizes();
            for (const QPageSize &pageSize : pageSizes)
                m_ui.pageSizeCombo->addItem(pageSize.name(), QVariant::fromValue(pageSize));
            if (m_ui.pageSizeCombo->count() > 0) {
                if (printDevice.supportsCustomPageSizes()) {
                    m_ui.pageSizeCombo->addItem(tr("Custom"));
                    m_realCustomPageSizeIndex = m_ui.pageSizeCombo->count() - 1;
                }
                m_blockSignals = false;

                // If the defaultSize is index 0, setCurrentIndex won't emit the currentIndexChanged
                // signal; workaround the issue by initially setting the currentIndex to -1
                m_ui.pageSizeCombo->setCurrentIndex(-1);
                m_ui.pageSizeCombo->setCurrentIndex(m_ui.pageSizeCombo->findData(QVariant::fromValue(defaultSize)));
                return;
            }
        }
    }

    // If PdfFormat or no available printer page sizes, populate with all page sizes
    for (int id = 0; id < QPageSize::LastPageSize; ++id) {
        if (QPageSize::PageSizeId(id) == QPageSize::Custom) {
            m_ui.pageSizeCombo->addItem(tr("Custom"));
            m_realCustomPageSizeIndex = m_ui.pageSizeCombo->count() - 1;
        } else {
            QPageSize pageSize = QPageSize(QPageSize::PageSizeId(id));
            m_ui.pageSizeCombo->addItem(pageSize.name(), QVariant::fromValue(pageSize));
        }
    }

    m_blockSignals = false;
}